

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O3

string * cfgfile::generator::generate_class_name(string *__return_storage_ptr__,string *name)

{
  pointer pcVar1;
  long lVar2;
  string *extraout_RAX;
  string *psVar3;
  string *local_38 [2];
  _Alloc_hider local_28;
  
  lVar2 = std::__cxx11::string::rfind
                    ((char *)name,cfg::c_namespace_separator_abi_cxx11_,0xffffffffffffffff);
  if (lVar2 == -1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)name);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if (lVar2 == -1) {
    local_38[0] = (string *)&local_28;
    pcVar1 = (name->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_38,pcVar1,pcVar1 + name->_M_string_length);
  }
  else {
    std::__cxx11::string::substr((ulong)local_38,(ulong)name);
  }
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_38[0]);
  psVar3 = (string *)&local_28;
  if (local_38[0] != psVar3) {
    operator_delete(local_38[0],(ulong)(local_28._M_p + 1));
    psVar3 = extraout_RAX;
  }
  return psVar3;
}

Assistant:

static inline std::string generate_class_name( const std::string & name )
{
	const auto pos = name.rfind( cfg::c_namespace_separator );

	std::string res = ( pos == std::string::npos ? std::string() :
		name.substr( 0, pos + cfg::c_namespace_separator.length() ) );
	res.append( "tag_" );
	res.append( ( pos == std::string::npos ? name :
		name.substr( pos + cfg::c_namespace_separator.length() ) ) );

	return res;
}